

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLLoader.cpp
# Opt level: O1

int Load_ARB_vertex_shader(void)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  
  sf_ptrc_glBindAttribLocationARB =
       (_func_void_GLhandleARB_GLuint_GLcharARB_ptr *)
       sf::Context::getFunction("glBindAttribLocationARB");
  bVar22 = sf_ptrc_glBindAttribLocationARB == (_func_void_GLhandleARB_GLuint_GLcharARB_ptr *)0x0;
  sf_ptrc_glDisableVertexAttribArrayARB =
       (_func_void_GLuint *)sf::Context::getFunction("glDisableVertexAttribArrayARB");
  uVar1 = bVar22 + 1;
  if (sf_ptrc_glDisableVertexAttribArrayARB != (_func_void_GLuint *)0x0) {
    uVar1 = (uint)bVar22;
  }
  sf_ptrc_glEnableVertexAttribArrayARB =
       (_func_void_GLuint *)sf::Context::getFunction("glEnableVertexAttribArrayARB");
  bVar23 = sf_ptrc_glEnableVertexAttribArrayARB == (_func_void_GLuint *)0x0;
  sf_ptrc_glGetActiveAttribARB =
       (_func_void_GLhandleARB_GLuint_GLsizei_GLsizei_ptr_GLint_ptr_GLenum_ptr_GLcharARB_ptr *)
       sf::Context::getFunction("glGetActiveAttribARB");
  bVar22 = sf_ptrc_glGetActiveAttribARB ==
           (_func_void_GLhandleARB_GLuint_GLsizei_GLsizei_ptr_GLint_ptr_GLenum_ptr_GLcharARB_ptr *)
           0x0;
  sf_ptrc_glGetAttribLocationARB =
       (_func_GLint_GLhandleARB_GLcharARB_ptr *)sf::Context::getFunction("glGetAttribLocationARB");
  bVar24 = sf_ptrc_glGetAttribLocationARB == (_func_GLint_GLhandleARB_GLcharARB_ptr *)0x0;
  sf_ptrc_glGetVertexAttribPointervARB =
       (_func_void_GLuint_GLenum_void_ptr_ptr *)
       sf::Context::getFunction("glGetVertexAttribPointervARB");
  bVar2 = sf_ptrc_glGetVertexAttribPointervARB == (_func_void_GLuint_GLenum_void_ptr_ptr *)0x0;
  sf_ptrc_glGetVertexAttribdvARB =
       (_func_void_GLuint_GLenum_GLdouble_ptr *)sf::Context::getFunction("glGetVertexAttribdvARB");
  bVar25 = sf_ptrc_glGetVertexAttribdvARB == (_func_void_GLuint_GLenum_GLdouble_ptr *)0x0;
  sf_ptrc_glGetVertexAttribfvARB =
       (_func_void_GLuint_GLenum_GLfloat_ptr *)sf::Context::getFunction("glGetVertexAttribfvARB");
  bVar3 = sf_ptrc_glGetVertexAttribfvARB == (_func_void_GLuint_GLenum_GLfloat_ptr *)0x0;
  sf_ptrc_glGetVertexAttribivARB =
       (_func_void_GLuint_GLenum_GLint_ptr *)sf::Context::getFunction("glGetVertexAttribivARB");
  bVar26 = sf_ptrc_glGetVertexAttribivARB == (_func_void_GLuint_GLenum_GLint_ptr *)0x0;
  sf_ptrc_glVertexAttrib1dARB =
       (_func_void_GLuint_GLdouble *)sf::Context::getFunction("glVertexAttrib1dARB");
  bVar4 = sf_ptrc_glVertexAttrib1dARB == (_func_void_GLuint_GLdouble *)0x0;
  sf_ptrc_glVertexAttrib1dvARB =
       (_func_void_GLuint_GLdouble_ptr *)sf::Context::getFunction("glVertexAttrib1dvARB");
  bVar27 = sf_ptrc_glVertexAttrib1dvARB == (_func_void_GLuint_GLdouble_ptr *)0x0;
  sf_ptrc_glVertexAttrib1fARB =
       (_func_void_GLuint_GLfloat *)sf::Context::getFunction("glVertexAttrib1fARB");
  bVar5 = sf_ptrc_glVertexAttrib1fARB == (_func_void_GLuint_GLfloat *)0x0;
  sf_ptrc_glVertexAttrib1fvARB =
       (_func_void_GLuint_GLfloat_ptr *)sf::Context::getFunction("glVertexAttrib1fvARB");
  bVar28 = sf_ptrc_glVertexAttrib1fvARB == (_func_void_GLuint_GLfloat_ptr *)0x0;
  sf_ptrc_glVertexAttrib1sARB =
       (_func_void_GLuint_GLshort *)sf::Context::getFunction("glVertexAttrib1sARB");
  bVar6 = sf_ptrc_glVertexAttrib1sARB == (_func_void_GLuint_GLshort *)0x0;
  sf_ptrc_glVertexAttrib1svARB =
       (_func_void_GLuint_GLshort_ptr *)sf::Context::getFunction("glVertexAttrib1svARB");
  bVar29 = sf_ptrc_glVertexAttrib1svARB == (_func_void_GLuint_GLshort_ptr *)0x0;
  sf_ptrc_glVertexAttrib2dARB =
       (_func_void_GLuint_GLdouble_GLdouble *)sf::Context::getFunction("glVertexAttrib2dARB");
  bVar7 = sf_ptrc_glVertexAttrib2dARB == (_func_void_GLuint_GLdouble_GLdouble *)0x0;
  sf_ptrc_glVertexAttrib2dvARB =
       (_func_void_GLuint_GLdouble_ptr *)sf::Context::getFunction("glVertexAttrib2dvARB");
  bVar30 = sf_ptrc_glVertexAttrib2dvARB == (_func_void_GLuint_GLdouble_ptr *)0x0;
  sf_ptrc_glVertexAttrib2fARB =
       (_func_void_GLuint_GLfloat_GLfloat *)sf::Context::getFunction("glVertexAttrib2fARB");
  bVar8 = sf_ptrc_glVertexAttrib2fARB == (_func_void_GLuint_GLfloat_GLfloat *)0x0;
  sf_ptrc_glVertexAttrib2fvARB =
       (_func_void_GLuint_GLfloat_ptr *)sf::Context::getFunction("glVertexAttrib2fvARB");
  bVar31 = sf_ptrc_glVertexAttrib2fvARB == (_func_void_GLuint_GLfloat_ptr *)0x0;
  sf_ptrc_glVertexAttrib2sARB =
       (_func_void_GLuint_GLshort_GLshort *)sf::Context::getFunction("glVertexAttrib2sARB");
  bVar9 = sf_ptrc_glVertexAttrib2sARB == (_func_void_GLuint_GLshort_GLshort *)0x0;
  sf_ptrc_glVertexAttrib2svARB =
       (_func_void_GLuint_GLshort_ptr *)sf::Context::getFunction("glVertexAttrib2svARB");
  bVar32 = sf_ptrc_glVertexAttrib2svARB == (_func_void_GLuint_GLshort_ptr *)0x0;
  sf_ptrc_glVertexAttrib3dARB =
       (_func_void_GLuint_GLdouble_GLdouble_GLdouble *)
       sf::Context::getFunction("glVertexAttrib3dARB");
  bVar10 = sf_ptrc_glVertexAttrib3dARB == (_func_void_GLuint_GLdouble_GLdouble_GLdouble *)0x0;
  sf_ptrc_glVertexAttrib3dvARB =
       (_func_void_GLuint_GLdouble_ptr *)sf::Context::getFunction("glVertexAttrib3dvARB");
  bVar33 = sf_ptrc_glVertexAttrib3dvARB == (_func_void_GLuint_GLdouble_ptr *)0x0;
  sf_ptrc_glVertexAttrib3fARB =
       (_func_void_GLuint_GLfloat_GLfloat_GLfloat *)sf::Context::getFunction("glVertexAttrib3fARB");
  bVar11 = sf_ptrc_glVertexAttrib3fARB == (_func_void_GLuint_GLfloat_GLfloat_GLfloat *)0x0;
  sf_ptrc_glVertexAttrib3fvARB =
       (_func_void_GLuint_GLfloat_ptr *)sf::Context::getFunction("glVertexAttrib3fvARB");
  bVar34 = sf_ptrc_glVertexAttrib3fvARB == (_func_void_GLuint_GLfloat_ptr *)0x0;
  sf_ptrc_glVertexAttrib3sARB =
       (_func_void_GLuint_GLshort_GLshort_GLshort *)sf::Context::getFunction("glVertexAttrib3sARB");
  bVar12 = sf_ptrc_glVertexAttrib3sARB == (_func_void_GLuint_GLshort_GLshort_GLshort *)0x0;
  sf_ptrc_glVertexAttrib3svARB =
       (_func_void_GLuint_GLshort_ptr *)sf::Context::getFunction("glVertexAttrib3svARB");
  bVar35 = sf_ptrc_glVertexAttrib3svARB == (_func_void_GLuint_GLshort_ptr *)0x0;
  sf_ptrc_glVertexAttrib4NbvARB =
       (_func_void_GLuint_GLbyte_ptr *)sf::Context::getFunction("glVertexAttrib4NbvARB");
  bVar13 = sf_ptrc_glVertexAttrib4NbvARB == (_func_void_GLuint_GLbyte_ptr *)0x0;
  sf_ptrc_glVertexAttrib4NivARB =
       (_func_void_GLuint_GLint_ptr *)sf::Context::getFunction("glVertexAttrib4NivARB");
  bVar36 = sf_ptrc_glVertexAttrib4NivARB == (_func_void_GLuint_GLint_ptr *)0x0;
  sf_ptrc_glVertexAttrib4NsvARB =
       (_func_void_GLuint_GLshort_ptr *)sf::Context::getFunction("glVertexAttrib4NsvARB");
  bVar14 = sf_ptrc_glVertexAttrib4NsvARB == (_func_void_GLuint_GLshort_ptr *)0x0;
  sf_ptrc_glVertexAttrib4NubARB =
       (_func_void_GLuint_GLubyte_GLubyte_GLubyte_GLubyte *)
       sf::Context::getFunction("glVertexAttrib4NubARB");
  bVar37 = sf_ptrc_glVertexAttrib4NubARB == (_func_void_GLuint_GLubyte_GLubyte_GLubyte_GLubyte *)0x0
  ;
  sf_ptrc_glVertexAttrib4NubvARB =
       (_func_void_GLuint_GLubyte_ptr *)sf::Context::getFunction("glVertexAttrib4NubvARB");
  bVar15 = sf_ptrc_glVertexAttrib4NubvARB == (_func_void_GLuint_GLubyte_ptr *)0x0;
  sf_ptrc_glVertexAttrib4NuivARB =
       (_func_void_GLuint_GLuint_ptr *)sf::Context::getFunction("glVertexAttrib4NuivARB");
  bVar38 = sf_ptrc_glVertexAttrib4NuivARB == (_func_void_GLuint_GLuint_ptr *)0x0;
  sf_ptrc_glVertexAttrib4NusvARB =
       (_func_void_GLuint_GLushort_ptr *)sf::Context::getFunction("glVertexAttrib4NusvARB");
  bVar16 = sf_ptrc_glVertexAttrib4NusvARB == (_func_void_GLuint_GLushort_ptr *)0x0;
  sf_ptrc_glVertexAttrib4bvARB =
       (_func_void_GLuint_GLbyte_ptr *)sf::Context::getFunction("glVertexAttrib4bvARB");
  bVar39 = sf_ptrc_glVertexAttrib4bvARB == (_func_void_GLuint_GLbyte_ptr *)0x0;
  sf_ptrc_glVertexAttrib4dARB =
       (_func_void_GLuint_GLdouble_GLdouble_GLdouble_GLdouble *)
       sf::Context::getFunction("glVertexAttrib4dARB");
  bVar17 = sf_ptrc_glVertexAttrib4dARB ==
           (_func_void_GLuint_GLdouble_GLdouble_GLdouble_GLdouble *)0x0;
  sf_ptrc_glVertexAttrib4dvARB =
       (_func_void_GLuint_GLdouble_ptr *)sf::Context::getFunction("glVertexAttrib4dvARB");
  bVar40 = sf_ptrc_glVertexAttrib4dvARB == (_func_void_GLuint_GLdouble_ptr *)0x0;
  sf_ptrc_glVertexAttrib4fARB =
       (_func_void_GLuint_GLfloat_GLfloat_GLfloat_GLfloat *)
       sf::Context::getFunction("glVertexAttrib4fARB");
  bVar18 = sf_ptrc_glVertexAttrib4fARB == (_func_void_GLuint_GLfloat_GLfloat_GLfloat_GLfloat *)0x0;
  sf_ptrc_glVertexAttrib4fvARB =
       (_func_void_GLuint_GLfloat_ptr *)sf::Context::getFunction("glVertexAttrib4fvARB");
  bVar41 = sf_ptrc_glVertexAttrib4fvARB == (_func_void_GLuint_GLfloat_ptr *)0x0;
  sf_ptrc_glVertexAttrib4ivARB =
       (_func_void_GLuint_GLint_ptr *)sf::Context::getFunction("glVertexAttrib4ivARB");
  bVar19 = sf_ptrc_glVertexAttrib4ivARB == (_func_void_GLuint_GLint_ptr *)0x0;
  sf_ptrc_glVertexAttrib4sARB =
       (_func_void_GLuint_GLshort_GLshort_GLshort_GLshort *)
       sf::Context::getFunction("glVertexAttrib4sARB");
  bVar42 = sf_ptrc_glVertexAttrib4sARB == (_func_void_GLuint_GLshort_GLshort_GLshort_GLshort *)0x0;
  sf_ptrc_glVertexAttrib4svARB =
       (_func_void_GLuint_GLshort_ptr *)sf::Context::getFunction("glVertexAttrib4svARB");
  bVar20 = sf_ptrc_glVertexAttrib4svARB == (_func_void_GLuint_GLshort_ptr *)0x0;
  sf_ptrc_glVertexAttrib4ubvARB =
       (_func_void_GLuint_GLubyte_ptr *)sf::Context::getFunction("glVertexAttrib4ubvARB");
  bVar43 = sf_ptrc_glVertexAttrib4ubvARB == (_func_void_GLuint_GLubyte_ptr *)0x0;
  sf_ptrc_glVertexAttrib4uivARB =
       (_func_void_GLuint_GLuint_ptr *)sf::Context::getFunction("glVertexAttrib4uivARB");
  bVar21 = sf_ptrc_glVertexAttrib4uivARB == (_func_void_GLuint_GLuint_ptr *)0x0;
  sf_ptrc_glVertexAttrib4usvARB =
       (_func_void_GLuint_GLushort_ptr *)sf::Context::getFunction("glVertexAttrib4usvARB");
  bVar44 = sf_ptrc_glVertexAttrib4usvARB == (_func_void_GLuint_GLushort_ptr *)0x0;
  sf_ptrc_glVertexAttribPointerARB =
       (_func_void_GLuint_GLint_GLenum_GLboolean_GLsizei_void_ptr *)
       sf::Context::getFunction("glVertexAttribPointerARB");
  return (uint)bVar44 +
         (uint)bVar43 +
         (uint)bVar42 +
         (uint)bVar41 +
         (uint)bVar40 +
         (uint)bVar39 +
         (uint)bVar38 +
         (uint)bVar37 +
         (uint)bVar36 +
         (uint)bVar35 +
         (uint)bVar34 +
         (uint)bVar33 +
         (uint)bVar32 +
         (uint)bVar31 +
         (uint)bVar30 +
         (uint)bVar29 +
         (uint)bVar28 +
         (uint)bVar27 +
         (uint)bVar26 +
         (uint)bVar25 + (uint)bVar24 + bVar23 + uVar1 + (uint)bVar22 + (uint)bVar2 + (uint)bVar3 +
         (uint)bVar4 + (uint)bVar5 + (uint)bVar6 + (uint)bVar7 + (uint)bVar8 + (uint)bVar9 +
         (uint)bVar10 + (uint)bVar11 + (uint)bVar12 + (uint)bVar13 + (uint)bVar14 + (uint)bVar15 +
         (uint)bVar16 + (uint)bVar17 + (uint)bVar18 + (uint)bVar19 + (uint)bVar20 + (uint)bVar21 +
         (uint)(sf_ptrc_glVertexAttribPointerARB ==
               (_func_void_GLuint_GLint_GLenum_GLboolean_GLsizei_void_ptr *)0x0);
}

Assistant:

static sf::GlFunctionPointer glLoaderGetProcAddress(const char* name)
{
    return sf::Context::getFunction(name);
}